

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,format_specs *specs,char_writer *f)

{
  basic_writer<fmt::v6::buffer_range<char>_> *this_00;
  char *pcVar1;
  fill_t<char> *fill;
  char *pcVar2;
  char_writer *in_RDX;
  long in_RSI;
  size_t left_padding;
  checked_ptr<typename_buffer<char>::value_type> *it;
  size_t fill_size;
  size_t padding;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff88;
  char **it_00;
  checked_ptr<typename_buffer<char>::value_type> local_38;
  basic_writer<fmt::v6::buffer_range<char>_> *local_30;
  basic_writer<fmt::v6::buffer_range<char>_> *local_28;
  type local_1c;
  char_writer *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = to_unsigned<int>(0);
  this_00 = (basic_writer<fmt::v6::buffer_range<char>_> *)
            arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>::
            char_writer::size((char_writer *)local_18);
  local_28 = this_00;
  if (local_1c != 0) {
    this_00 = (basic_writer<fmt::v6::buffer_range<char>_> *)
              arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>::
              char_writer::width((char_writer *)local_18);
  }
  local_30 = this_00;
  if (this_00 < (basic_writer<fmt::v6::buffer_range<char>_> *)(ulong)local_1c) {
    pcVar1 = (char *)fill_t<char>::size((fill_t<char> *)(local_10 + 10));
    fill = (fill_t<char> *)
           basic_writer<fmt::v6::buffer_range<char>_>::reserve(this_00,in_stack_ffffffffffffff88);
    it_00 = (char **)&stack0xffffffffffffffa8;
    if ((*(byte *)(local_10 + 9) & 0xf) == 2) {
      pcVar1 = fill<char*,char>(pcVar1,(size_t)it_00,fill);
      *it_00 = pcVar1;
      arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer
      ::operator()(local_18,it_00);
    }
    else if ((*(byte *)(local_10 + 9) & 0xf) == 3) {
      pcVar2 = fill<char*,char>(pcVar1,(size_t)it_00,fill);
      *it_00 = pcVar2;
      arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer
      ::operator()(local_18,it_00);
      pcVar1 = fill<char*,char>(pcVar1,(size_t)it_00,fill);
      *it_00 = pcVar1;
    }
    else {
      arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer
      ::operator()(local_18,it_00);
      pcVar1 = fill<char*,char>(pcVar1,(size_t)it_00,fill);
      *it_00 = pcVar1;
    }
  }
  else {
    local_38 = basic_writer<fmt::v6::buffer_range<char>_>::reserve(this_00,(size_t)local_18);
    arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer::
    operator()(local_18,&local_38);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }